

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O3

void __thiscall
Assimp::glTF2Exporter::GetMatTex
          (glTF2Exporter *this,aiMaterial *mat,Ref<glTF2::Texture> *texture,aiTextureType tt,
          uint slot)

{
  char *__s;
  _Rb_tree_color _Var1;
  Asset *this_00;
  Texture *pTVar2;
  aiTexture **ppaVar3;
  aiTexture *paVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  uint uVar7;
  aiReturn aVar8;
  int iVar9;
  size_t sVar10;
  iterator iVar11;
  mapped_type_conflict3 *pmVar12;
  Ref<glTF2::Texture> RVar13;
  Ref<glTF2::Image> RVar14;
  string mimeType;
  string imgId;
  string path;
  string texId;
  aiString tex;
  string local_4c0;
  Asset *local_4a0;
  string local_498;
  key_type local_478;
  string local_458;
  aiString local_434;
  
  uVar7 = aiGetMaterialTextureCount(mat,tt);
  if (uVar7 != 0) {
    local_434.length = 0;
    local_434.data[0] = '\0';
    memset(local_434.data + 1,0x1b,0x3ff);
    aVar8 = aiGetMaterialString(mat,"$tex.file",tt,slot,&local_434);
    if (aVar8 == aiReturn_SUCCESS) {
      __s = local_434.data;
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      sVar10 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,__s,__s + sVar10);
      if (local_478._M_string_length != 0) {
        iVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&(this->mTexturesByPath)._M_t,&local_478);
        if ((_Rb_tree_header *)iVar11._M_node ==
            &(this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header) {
          if (texture->vector == (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0)
          {
            local_4a0 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
            local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"");
            glTF2::Asset::FindUniqueID(&local_458,local_4a0,&local_498,"texture");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != &local_498.field_2) {
              operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1
                             );
            }
            RVar13 = glTF2::LazyDict<glTF2::Texture>::Create
                               (&((this->mAsset).
                                  super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->textures,local_458._M_dataplus._M_p);
            texture->vector = RVar13.vector;
            local_4a0 = (Asset *)CONCAT44(local_4a0._4_4_,RVar13.index);
            texture->index = RVar13.index;
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[](&this->mTexturesByPath,&local_478);
            *pmVar12 = (mapped_type_conflict3)local_4a0;
            this_00 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"");
            glTF2::Asset::FindUniqueID(&local_498,this_00,&local_4c0,"image");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
              operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1
                             );
            }
            RVar14 = glTF2::LazyDict<glTF2::Image>::Create
                               (&((this->mAsset).
                                  super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->images,local_498._M_dataplus._M_p);
            pTVar2 = (texture->vector->
                     super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
                     _M_impl.super__Vector_impl_data._M_start[texture->index];
            (pTVar2->source).vector = RVar14.vector;
            (pTVar2->source).index = RVar14.index;
            if (*local_478._M_dataplus._M_p == '*') {
              ppaVar3 = this->mScene->mTextures;
              iVar9 = atoi(local_478._M_dataplus._M_p + 1);
              paVar4 = ppaVar3[iVar9];
              pTVar2 = (texture->vector->
                       super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[texture->index];
              glTF2::Image::SetData
                        (*(Image **)
                          (*(long *)&((pTVar2->source).vector)->
                                     super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>
                          + (ulong)(pTVar2->source).index * 8),&paVar4->pcData->b,
                         (ulong)paVar4->mWidth,
                         (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              if (paVar4->achFormatHint[0] != '\0') {
                local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"image/","");
                std::__cxx11::string::append((char *)&local_4c0);
                pTVar2 = (texture->vector->
                         super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[texture->index];
                std::__cxx11::string::_M_assign
                          ((string *)
                           (*(long *)(*(long *)&((pTVar2->source).vector)->
                                                super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>
                                     + (ulong)(pTVar2->source).index * 8) + 0x80));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
                  operator_delete(local_4c0._M_dataplus._M_p,
                                  local_4c0.field_2._M_allocated_capacity + 1);
                }
              }
            }
            else {
              pTVar2 = (texture->vector->
                       super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[texture->index];
              std::__cxx11::string::_M_assign
                        ((string *)
                         (*(long *)(*(long *)&((pTVar2->source).vector)->
                                              super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>
                                   + (ulong)(pTVar2->source).index * 8) + 0x50));
            }
            uVar5 = texture->vector;
            uVar6 = texture->index;
            RVar13.index = uVar6;
            RVar13.vector = (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)uVar5;
            RVar13._12_4_ = 0;
            GetTexSampler(this,mat,RVar13,tt,slot);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != &local_498.field_2) {
              operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
              operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        else {
          _Var1 = iVar11._M_node[2]._M_color;
          texture->vector =
               &(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->textures).mObjs;
          texture->index = _Var1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void glTF2Exporter::GetMatTex(const aiMaterial* mat, Ref<Texture>& texture, aiTextureType tt, unsigned int slot = 0)
{

    if (mat->GetTextureCount(tt) > 0) {
        aiString tex;

        if (mat->Get(AI_MATKEY_TEXTURE(tt, slot), tex) == AI_SUCCESS) {
            std::string path = tex.C_Str();

            if (path.size() > 0) {
                std::map<std::string, unsigned int>::iterator it = mTexturesByPath.find(path);
                if (it != mTexturesByPath.end()) {
                    texture = mAsset->textures.Get(it->second);
                }

                if (!texture) {
                    std::string texId = mAsset->FindUniqueID("", "texture");
                    texture = mAsset->textures.Create(texId);
                    mTexturesByPath[path] = texture.GetIndex();

                    std::string imgId = mAsset->FindUniqueID("", "image");
                    texture->source = mAsset->images.Create(imgId);

                    if (path[0] == '*') { // embedded
                        aiTexture* tex = mScene->mTextures[atoi(&path[1])];

                        uint8_t* data = reinterpret_cast<uint8_t*>(tex->pcData);
                        texture->source->SetData(data, tex->mWidth, *mAsset);

                        if (tex->achFormatHint[0]) {
                            std::string mimeType = "image/";
                            mimeType += (memcmp(tex->achFormatHint, "jpg", 3) == 0) ? "jpeg" : tex->achFormatHint;
                            texture->source->mimeType = mimeType;
                        }
                    }
                    else {
                        texture->source->uri = path;
                    }

                    GetTexSampler(mat, texture, tt, slot);
                }
            }
        }
    }
}